

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O0

void __thiscall
fe::operations::op_blend_one_invSrcAlpha::operator()
          (op_blend_one_invSrcAlpha *this,PixelR8G8B8A8 *srcPixelFormat,
          PixelDISTANCE *destPixelFormat,uchar *srcData,uchar *destData,int x,int y)

{
  uchar local_54;
  uchar local_50;
  uchar local_4c;
  uchar local_48;
  anon_union_4_3_3c41bd51_for_Pixel_0 local_44;
  byte local_3d;
  Pixel r;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  uchar ia;
  Pixel d;
  Pixel s;
  int x_local;
  uchar *destData_local;
  uchar *srcData_local;
  PixelDISTANCE *destPixelFormat_local;
  PixelR8G8B8A8 *srcPixelFormat_local;
  op_blend_one_invSrcAlpha *this_local;
  
  d.field_0 = (anon_union_4_3_3c41bd51_for_Pixel_0)x;
  PixelR8G8B8A8::getPixel(srcPixelFormat,srcData,(Pixel *)&stack0xffffffffffffffc8,x,y);
  PixelDISTANCE::getPixel(destPixelFormat,destData,&r,(int)d.field_0,y);
  local_3d = -ia - 1;
  if (((uint)r.field_0.field_0.bytes[0] * (uint)local_3d) / 0xff + (uint)(byte)local_38 < 0xff) {
    local_48 = (char)(((uint)r.field_0.field_0.bytes[0] * (uint)local_3d) / 0xff) + local_38;
  }
  else {
    local_48 = 0xff;
  }
  local_44.field_0.bytes[0] = local_48;
  if (((uint)r.field_0.field_0.bytes[1] * (uint)local_3d) / 0xff + (uint)(byte)local_37 < 0xff) {
    local_4c = (char)(((uint)r.field_0.field_0.bytes[1] * (uint)local_3d) / 0xff) + local_37;
  }
  else {
    local_4c = 0xff;
  }
  local_44.field_0.bytes[1] = local_4c;
  if (((uint)r.field_0.field_0.bytes[2] * (uint)local_3d) / 0xff + (uint)(byte)local_36 < 0xff) {
    local_50 = (char)(((uint)r.field_0.field_0.bytes[2] * (uint)local_3d) / 0xff) + local_36;
  }
  else {
    local_50 = 0xff;
  }
  local_44.field_0.bytes[2] = local_50;
  if (((uint)r.field_0.field_0.bytes[3] * (uint)local_3d) / 0xff + (uint)ia < 0xff) {
    local_54 = (char)(((uint)r.field_0.field_0.bytes[3] * (uint)local_3d) / 0xff) + ia;
  }
  else {
    local_54 = 0xff;
  }
  local_44.field_0.bytes[3] = local_54;
  PixelDISTANCE::setPixel(destPixelFormat,destData,(Pixel *)&local_44.field_0);
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel s;
                srcPixelFormat.getPixel(srcData, s, OPERATOR_ARGS_PASS);

                Pixel d;
                destPixelFormat.getPixel(destData, d, OPERATOR_ARGS_PASS);

#define M(v) v < 255 ? v : 255;
                unsigned char ia = 255 - s.a;
                Pixel r;
                r.r = M((d.r * ia) / 255 + s.r);
                r.g = M((d.g * ia) / 255 + s.g);
                r.b = M((d.b * ia) / 255 + s.b);
                r.a = M((d.a * ia) / 255 + s.a);
#undef  M

                destPixelFormat.setPixel(destData, r);
            }